

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  DTableDesc DVar1;
  uint uVar2;
  uint uVar3;
  BIT_DStream_t *code;
  size_t sVar4;
  size_t in_RCX;
  void *in_RDX;
  ulong uVar5;
  BIT_DStream_t *in_RSI;
  uchar *in_RDI;
  HUF_DTable *in_R8;
  bool bVar6;
  size_t _var_err__;
  U32 dtLog;
  DTableDesc dtd;
  BIT_DStream_t bitD;
  HUF_DEltX1 *dt;
  void *dtPtr;
  BYTE *oend;
  BYTE *op;
  BYTE *pStart;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  BYTE c;
  size_t val;
  BYTE c_2;
  size_t val_2;
  BYTE c_3;
  size_t val_3;
  BYTE c_1;
  size_t val_1;
  BYTE c_4;
  size_t val_4;
  BYTE c_5;
  size_t val_5;
  void *in_stack_fffffffffffffd88;
  BIT_DStream_t local_238;
  HUF_DTable *local_210;
  HUF_DTable *local_208;
  uchar *local_200;
  uchar *local_1f8;
  HUF_DTable *local_1f0;
  BIT_DStream_t *local_1d8;
  BIT_DStream_t *local_1c8;
  uchar *local_1c0;
  uint local_1b4;
  HUF_DTable *local_1b0;
  uchar *local_1a8;
  BIT_DStream_t *local_1a0;
  uchar *local_198;
  BIT_DStream_status local_190;
  uint local_18c;
  BIT_DStream_t *local_188;
  BIT_DStream_status local_17c;
  BIT_DStream_status local_178;
  uint local_174;
  BIT_DStream_t *local_170;
  BIT_DStream_status local_164;
  BIT_DStream_status local_160;
  uint local_15c;
  BIT_DStream_t *local_158;
  BIT_DStream_status local_150;
  uchar local_149;
  size_t local_148;
  U32 local_13c;
  HUF_DTable *local_138;
  BIT_DStream_t *local_130;
  uint local_124;
  BIT_DStream_t *local_120;
  uchar local_111;
  size_t local_110;
  U32 local_104;
  HUF_DTable *local_100;
  BIT_DStream_t *local_f8;
  uint local_ec;
  BIT_DStream_t *local_e8;
  uchar local_d9;
  size_t local_d8;
  U32 local_cc;
  HUF_DTable *local_c8;
  BIT_DStream_t *local_c0;
  uint local_b4;
  BIT_DStream_t *local_b0;
  uchar local_a1;
  size_t local_a0;
  U32 local_94;
  HUF_DTable *local_90;
  BIT_DStream_t *local_88;
  uint local_7c;
  BIT_DStream_t *local_78;
  uchar local_69;
  size_t local_68;
  U32 local_5c;
  HUF_DTable *local_58;
  BIT_DStream_t *local_50;
  uint local_44;
  BIT_DStream_t *local_40;
  uchar local_31;
  size_t local_30;
  U32 local_24;
  HUF_DTable *local_20;
  BIT_DStream_t *local_18;
  uint local_c;
  BIT_DStream_t *local_8;
  
  local_1f8 = in_RDI;
  local_1f0 = in_R8;
  local_1d8 = in_RSI;
  local_200 = ZSTD_maybeNullPtrAdd(in_RDI,(ptrdiff_t)in_RSI);
  local_210 = local_1f0 + 1;
  local_208 = local_210;
  DVar1 = HUF_getDTableDesc(local_1f0);
  uVar3 = (uint)DVar1 >> 0x10 & 0xff;
  code = (BIT_DStream_t *)BIT_initDStream(in_RSI,in_RDX,in_RCX);
  uVar2 = ERR_isError((size_t)code);
  local_1c8 = code;
  if (uVar2 == 0) {
    local_198 = local_1f8;
    local_1a0 = &local_238;
    local_1a8 = local_200;
    local_1b0 = local_210;
    local_1c0 = local_1f8;
    local_1b4 = uVar3;
    if ((long)local_200 - (long)local_1f8 < 4) {
      local_170 = local_1a0;
      if (local_238.bitsConsumed < 0x41) {
        if (local_238.ptr < local_238.limitPtr) {
          if (local_238.ptr == local_238.start) {
            if (local_238.bitsConsumed < 0x40) {
              local_164 = BIT_DStream_endOfBuffer;
            }
            else {
              local_164 = BIT_DStream_completed;
            }
          }
          else {
            local_174 = local_238.bitsConsumed >> 3;
            uVar5 = (ulong)local_174;
            if (local_238.ptr + -uVar5 < local_238.start) {
              local_174 = (int)local_238.ptr - (int)local_238.start;
            }
            local_178 = (BIT_DStream_status)(local_238.ptr + -uVar5 < local_238.start);
            local_238.ptr = local_238.ptr + -(ulong)local_174;
            sVar4 = MEM_readLEST(in_stack_fffffffffffffd88);
            local_170->bitContainer = sVar4;
            local_164 = local_178;
          }
        }
        else {
          local_164 = BIT_reloadDStream_internal((BIT_DStream_t *)0xa782e1);
        }
      }
      else {
        local_238.ptr = "";
        local_164 = BIT_DStream_overflow;
      }
    }
    else {
      while( true ) {
        local_158 = local_1a0;
        if (local_1a0->bitsConsumed < 0x41) {
          if (local_1a0->ptr < local_1a0->limitPtr) {
            if (local_1a0->ptr == local_1a0->start) {
              if (local_1a0->bitsConsumed < 0x40) {
                local_150 = BIT_DStream_endOfBuffer;
              }
              else {
                local_150 = BIT_DStream_completed;
              }
            }
            else {
              local_15c = local_1a0->bitsConsumed >> 3;
              bVar6 = local_1a0->ptr + -(ulong)local_15c < local_1a0->start;
              if (bVar6) {
                local_15c = (int)local_1a0->ptr - (int)local_1a0->start;
              }
              local_160 = (BIT_DStream_status)bVar6;
              local_1a0->ptr = local_1a0->ptr + -(ulong)local_15c;
              local_158->bitsConsumed = local_158->bitsConsumed + local_15c * -8;
              sVar4 = MEM_readLEST(in_stack_fffffffffffffd88);
              local_158->bitContainer = sVar4;
              local_150 = local_160;
            }
          }
          else {
            local_150 = BIT_reloadDStream_internal((BIT_DStream_t *)0xa77dbc);
          }
        }
        else {
          local_1a0->ptr = "";
          local_150 = BIT_DStream_overflow;
        }
        if (local_150 != BIT_DStream_unfinished || local_1a8 + -3 <= local_198) break;
        uVar3 = MEM_64bits();
        if (uVar3 != 0) {
          local_130 = local_1a0;
          local_138 = local_1b0;
          local_13c = local_1b4;
          local_148 = BIT_lookBitsFast(local_1a0,local_1b4);
          local_149 = *(uchar *)((long)local_138 + local_148 * 2 + 1);
          local_120 = local_130;
          local_124 = (uint)*(byte *)((long)local_138 + local_148 * 2);
          local_130->bitsConsumed = local_124 + local_130->bitsConsumed;
          *local_198 = local_149;
          local_198 = local_198 + 1;
        }
        MEM_64bits();
        local_88 = local_1a0;
        local_90 = local_1b0;
        local_94 = local_1b4;
        local_a0 = BIT_lookBitsFast(local_1a0,local_1b4);
        local_a1 = *(uchar *)((long)local_90 + local_a0 * 2 + 1);
        local_78 = local_88;
        local_7c = (uint)*(byte *)((long)local_90 + local_a0 * 2);
        local_88->bitsConsumed = local_7c + local_88->bitsConsumed;
        *local_198 = local_a1;
        local_198 = local_198 + 1;
        uVar3 = MEM_64bits();
        if (uVar3 != 0) {
          local_f8 = local_1a0;
          local_100 = local_1b0;
          local_104 = local_1b4;
          local_110 = BIT_lookBitsFast(local_1a0,local_1b4);
          local_111 = *(uchar *)((long)local_100 + local_110 * 2 + 1);
          local_e8 = local_f8;
          local_ec = (uint)*(byte *)((long)local_100 + local_110 * 2);
          local_f8->bitsConsumed = local_ec + local_f8->bitsConsumed;
          *local_198 = local_111;
          local_198 = local_198 + 1;
        }
        local_c0 = local_1a0;
        local_c8 = local_1b0;
        local_cc = local_1b4;
        local_d8 = BIT_lookBitsFast(local_1a0,local_1b4);
        local_d9 = *(uchar *)((long)local_c8 + local_d8 * 2 + 1);
        local_b0 = local_c0;
        local_b4 = (uint)*(byte *)((long)local_c8 + local_d8 * 2);
        local_c0->bitsConsumed = local_b4 + local_c0->bitsConsumed;
        *local_198 = local_d9;
        local_198 = local_198 + 1;
      }
    }
    uVar3 = MEM_32bits();
    if (uVar3 != 0) {
      while( true ) {
        local_188 = local_1a0;
        if (local_1a0->bitsConsumed < 0x41) {
          if (local_1a0->ptr < local_1a0->limitPtr) {
            if (local_1a0->ptr == local_1a0->start) {
              if (local_1a0->bitsConsumed < 0x40) {
                local_17c = BIT_DStream_endOfBuffer;
              }
              else {
                local_17c = BIT_DStream_completed;
              }
            }
            else {
              local_18c = local_1a0->bitsConsumed >> 3;
              bVar6 = local_1a0->ptr + -(ulong)local_18c < local_1a0->start;
              if (bVar6) {
                local_18c = (int)local_1a0->ptr - (int)local_1a0->start;
              }
              local_190 = (BIT_DStream_status)bVar6;
              local_1a0->ptr = local_1a0->ptr + -(ulong)local_18c;
              local_188->bitsConsumed = local_188->bitsConsumed + local_18c * -8;
              sVar4 = MEM_readLEST(in_stack_fffffffffffffd88);
              local_188->bitContainer = sVar4;
              local_17c = local_190;
            }
          }
          else {
            local_17c = BIT_reloadDStream_internal((BIT_DStream_t *)0xa78495);
          }
        }
        else {
          local_1a0->ptr = "";
          local_17c = BIT_DStream_overflow;
        }
        if (local_17c != BIT_DStream_unfinished || local_1a8 <= local_198) break;
        local_50 = local_1a0;
        local_58 = local_1b0;
        local_5c = local_1b4;
        local_68 = BIT_lookBitsFast(local_1a0,local_1b4);
        local_69 = *(uchar *)((long)local_58 + local_68 * 2 + 1);
        local_40 = local_50;
        local_44 = (uint)*(byte *)((long)local_58 + local_68 * 2);
        local_50->bitsConsumed = local_44 + local_50->bitsConsumed;
        *local_198 = local_69;
        local_198 = local_198 + 1;
      }
    }
    while (local_198 < local_1a8) {
      local_18 = local_1a0;
      local_20 = local_1b0;
      local_24 = local_1b4;
      local_30 = BIT_lookBitsFast(local_1a0,local_1b4);
      local_31 = *(uchar *)((long)local_20 + local_30 * 2 + 1);
      local_8 = local_18;
      local_c = (uint)*(byte *)((long)local_20 + local_30 * 2);
      local_18->bitsConsumed = local_c + local_18->bitsConsumed;
      *local_198 = local_31;
      local_198 = local_198 + 1;
    }
    uVar3 = BIT_endOfDStream(&local_238);
    if (uVar3 == 0) {
      local_1c8 = (BIT_DStream_t *)0xffffffffffffffec;
    }
    else {
      local_1c8 = local_1d8;
    }
  }
  return (size_t)local_1c8;
}

Assistant:

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif
    if (HUF_ENABLE_FAST_DECODE && !(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}